

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchAI.cpp
# Opt level: O1

void __thiscall tiger::trains::ai::SwitchAI::step(SwitchAI *this)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  TrainAI *bot_00;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  vector<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_> *pvVar8;
  Town *this_00;
  IPost *pIVar9;
  Train *pTVar10;
  pointer ppTVar11;
  pointer ppTVar12;
  ulong uVar13;
  TrainAI *bot;
  TrainAI *local_38;
  
  pvVar8 = world::World::getPlayerList(this->world);
  this_00 = (Town *)world::Player::getHome
                              (*(pvVar8->
                                super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
  iVar5 = world::Town::getPopulation(this_00);
  pvVar8 = world::World::getPlayerList(this->world);
  pIVar9 = world::Player::getHome
                     (*(pvVar8->
                       super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  iVar6 = (*pIVar9->_vptr_IPost[0xb])(pIVar9);
  iVar5 = (iVar6 + iVar5) * 0x3c + -0x3c;
  ppTVar2 = (this->productBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar11 = (this->productBots).
                  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppTVar11 != ppTVar2;
      ppTVar11 = ppTVar11 + 1) {
    bot_00 = *ppTVar11;
    bVar4 = canSwitch(this,bot_00);
    if (!bVar4) {
      pTVar10 = TrainAI::getTrain(bot_00);
      iVar6 = world::Train::getGoodsCapacity(pTVar10);
      iVar5 = iVar5 - iVar6;
    }
  }
  ppTVar11 = (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->productBots).
      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
    uVar13 = 0;
    iVar6 = 0;
    do {
      local_38 = ppTVar11[uVar13];
      bVar4 = canSwitch(this,local_38);
      if (bVar4) {
        if (iVar5 < 1) {
          ppTVar11 = (this->productBots).
                     super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppTVar2 = (this->productBots).
                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (8 < (ulong)((long)ppTVar2 - (long)ppTVar11)) {
            ppTVar12 = ppTVar11 + uVar13 + 1;
            if (ppTVar12 != ppTVar2) {
              memmove(ppTVar11 + uVar13,ppTVar12,(long)ppTVar2 - (long)ppTVar12);
            }
            pppTVar1 = &(this->productBots).
                        super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + -1;
            TrainAI::changeType(local_38,ARMOR);
            iVar3._M_current =
                 (this->armorBots).
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->armorBots).
                super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>::
              _M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                        ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                          *)&this->armorBots,iVar3,&local_38);
            }
            else {
              *iVar3._M_current = local_38;
              pppTVar1 = &(this->armorBots).
                          super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            iVar6 = iVar6 + -1;
            goto LAB_00150fb8;
          }
        }
        pTVar10 = TrainAI::getTrain(local_38);
        iVar7 = world::Train::getGoodsCapacity(pTVar10);
        iVar5 = iVar5 - iVar7;
      }
LAB_00150fb8:
      iVar6 = iVar6 + 1;
      uVar13 = (ulong)iVar6;
      ppTVar11 = (this->productBots).
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->productBots).
                                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3
                             ));
  }
  ppTVar11 = (this->armorBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->armorBots).
      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar11) {
    uVar13 = 0;
    iVar6 = 0;
    do {
      local_38 = ppTVar11[uVar13];
      bVar4 = canSwitch(this,local_38);
      if ((bVar4) && (0 < iVar5)) {
        ppTVar11 = (this->armorBots).
                   super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar2 = (this->armorBots).
                  super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)((long)ppTVar2 - (long)ppTVar11) < 9) goto LAB_001510b3;
        ppTVar12 = ppTVar11 + uVar13 + 1;
        if (ppTVar12 != ppTVar2) {
          memmove(ppTVar11 + uVar13,ppTVar12,(long)ppTVar2 - (long)ppTVar12);
        }
        pppTVar1 = &(this->armorBots).
                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + -1;
        TrainAI::changeType(local_38,PRODUCT);
        iVar3._M_current =
             (this->productBots).
             super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->productBots).
            super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>::
          _M_realloc_insert<tiger::trains::ai::TrainAI*const&>
                    ((vector<tiger::trains::ai::TrainAI*,std::allocator<tiger::trains::ai::TrainAI*>>
                      *)&this->productBots,iVar3,&local_38);
        }
        else {
          *iVar3._M_current = local_38;
          pppTVar1 = &(this->productBots).
                      super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar1 = *pppTVar1 + 1;
        }
      }
      else {
LAB_001510b3:
        iVar6 = iVar6 + 1;
      }
      uVar13 = (ulong)iVar6;
      ppTVar11 = (this->armorBots).
                 super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->armorBots).
                                    super__Vector_base<tiger::trains::ai::TrainAI_*,_std::allocator<tiger::trains::ai::TrainAI_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3
                             ));
  }
  return;
}

Assistant:

void SwitchAI::step()
{
    int population = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getPopulation();
    int needProductCompacity;
    int level = static_cast<world::Town *>(world->getPlayerList()[0]->getHome())->getLevel();

    needProductCompacity = 60 *(population + level - 1);


    for (TrainAI *bot : productBots)
        if (!canSwitch(bot))
            needProductCompacity -= bot->getTrain()->getGoodsCapacity();


    int i = 0;

    while (i < productBots.size())
    {
        TrainAI *bot = productBots[i];

        if (canSwitch(bot))
            if (needProductCompacity > 0 || productBots.size() < 2)
                needProductCompacity -= bot->getTrain()->getGoodsCapacity();
            else
            {
                productBots.erase(productBots.begin() + i);
                bot->changeType(models::GoodType::ARMOR);
                armorBots.push_back(bot);
                i--;
            }

        i++;
    }

    i = 0;

    while (i < armorBots.size())
    {
        TrainAI *bot = armorBots[i];

        if (canSwitch(bot) && needProductCompacity > 0 && armorBots.size() > 1)
        {
            armorBots.erase(armorBots.begin() + i);
            bot->changeType(models::GoodType::PRODUCT);
            productBots.push_back(bot);
        }
        else
            i++;
    }
}